

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

RawSchema * __thiscall capnp::SchemaLoader::Impl::loadNative(Impl *this,RawSchema *nativeSchema)

{
  undefined8 uVar1;
  Initializer *pIVar2;
  uint64_t uVar3;
  word *pwVar4;
  uint16_t *puVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  bool bVar10;
  RawSchema *schema;
  RawSchema *pRVar11;
  RawSchema **ppRVar12;
  RawSchema *pRVar13;
  RawSchema **ppRVar14;
  ulong uVar15;
  bool bVar16;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar17;
  RawSchema *nativeSchema_local;
  Fault f;
  DebugComparison<const_capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> _kjCondition;
  Reader existing;
  CompatibilityChecker checker;
  ArrayPtr<const_char> local_80;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_70;
  ArrayPtr<const_char> local_58;
  WirePointer *local_48;
  int local_40;
  
  nativeSchema_local = nativeSchema;
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long_const&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&checker,(unsigned_long *)&this->schemas);
  pRVar13 = nativeSchema_local;
  if (checker.loader == (Impl *)0x0) {
    ppRVar14 = (RawSchema **)0x0;
    schema = (RawSchema *)kj::Arena::allocateBytes(&this->arena,0x78,8,false);
    *(undefined8 *)&schema->mayContainCapabilities = 0;
    (schema->defaultBrand).scopes = (Scope *)0x0;
    (schema->defaultBrand).dependencies = (Dependency *)0x0;
    schema->lazyInitializer = (Initializer *)0x0;
    (schema->defaultBrand).generic = (RawSchema *)0x0;
    (schema->defaultBrand).scopeCount = 0;
    (schema->defaultBrand).dependencyCount = 0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    schema->id = 0;
    schema->encodedNode = (word *)0x0;
    *(undefined8 *)&schema->encodedSize = 0;
    schema->dependencies = (RawSchema **)0x0;
    schema->membersByName = (uint16_t *)0x0;
    schema->dependencyCount = 0;
    schema->memberCount = 0;
    schema->membersByDiscriminant = (uint16_t *)0x0;
    schema->canCastTo = (RawSchema *)0x0;
    schema->mayContainCapabilities = true;
    (schema->defaultBrand).generic = (RawSchema *)0x0;
    (schema->defaultBrand).scopes = (Scope *)0x0;
    (schema->defaultBrand).dependencies = (Dependency *)0x0;
    (schema->defaultBrand).scopeCount = 0;
    (schema->defaultBrand).dependencyCount = 0;
    (schema->defaultBrand).generic = schema;
    schema->lazyInitializer = (Initializer *)0x0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    checker.loader = (Impl *)nativeSchema_local->id;
    checker.nodeName.super_StringPtr.content.ptr = (char *)schema;
    kj::
    Table<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
    ::insert(&(this->schemas).table,(Entry *)&checker);
    bVar16 = true;
    pRVar11 = (RawSchema *)0x1;
  }
  else {
    schema = (RawSchema *)((checker.loader)->arena).chunkList;
    pRVar11 = schema->canCastTo;
    bVar16 = pRVar11 == (RawSchema *)0x0;
    if (bVar16) {
      checker.nodeName.super_StringPtr.content.size_ = (size_t)schema->encodedNode;
      checker.loader = (Impl *)0x0;
      checker.nodeName.super_StringPtr.content.ptr = (char *)0x0;
      checker.existingNode._reader.segment._0_4_ = 0x7fffffff;
      capnp::_::PointerReader::getStruct(&existing._reader,(PointerReader *)&checker,(word *)0x0);
      checker.nodeName.super_StringPtr.content.size_ = (size_t)nativeSchema_local->encodedNode;
      checker.loader = (Impl *)0x0;
      checker.nodeName.super_StringPtr.content.ptr = (char *)0x0;
      checker.existingNode._reader.segment._0_4_ = 0x7fffffff;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&_kjCondition,(PointerReader *)&checker,(word *)0x0);
      checker.nodeName.super_StringPtr.content.ptr = "";
      checker.nodeName.super_StringPtr.content.size_ = 1;
      checker.existingNode._reader.segment._0_4_ = 0;
      checker.existingNode._reader.segment._4_4_ = 0;
      checker.existingNode._reader.capTable._0_1_ = 0;
      checker.existingNode._reader.capTable._1_7_ = 0;
      checker.existingNode._reader.data._0_1_ = 0;
      checker.existingNode._reader.data._1_7_ = 0;
      checker.existingNode._reader.pointers._0_6_ = 0;
      checker.existingNode._reader.pointers._6_2_ = 0;
      checker.existingNode._reader.dataSize = 0;
      checker.existingNode._reader.pointerCount = 0;
      checker.existingNode._reader.nestingLimit = 0x7fffffff;
      checker.replacementNode._reader.segment = (SegmentReader *)0x0;
      checker.replacementNode._reader.capTable = (CapTableReader *)0x0;
      checker.replacementNode._reader.data = (void *)0x0;
      checker.replacementNode._reader.pointers._0_6_ = 0;
      checker.replacementNode._reader.pointers._6_2_ = 0;
      checker.replacementNode._reader.dataSize = 0;
      checker.replacementNode._reader.pointerCount = 0;
      checker.replacementNode._reader.nestingLimit = 0x7fffffff;
      checker.loader = this;
      bVar10 = CompatibilityChecker::shouldReplace(&checker,&existing,(Reader *)&_kjCondition,true);
      pRVar11 = (RawSchema *)(ulong)bVar10;
      ppRVar14 = (RawSchema **)(ulong)(schema->lazyInitializer != (Initializer *)0x0);
    }
    else {
      ppRVar14 = &schema->canCastTo;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = pRVar11 == nativeSchema_local;
      _kjCondition.left = ppRVar14;
      _kjCondition.right = &nativeSchema_local;
      if (!_kjCondition.result) {
        existing._reader.data = nativeSchema_local->encodedNode;
        existing._reader.segment = (SegmentReader *)0x0;
        existing._reader.capTable = (CapTableReader *)0x0;
        existing._reader.pointers._0_4_ = 0x7fffffff;
        _kjCondition.right = &nativeSchema_local;
        capnp::_::PointerReader::getStruct
                  ((StructReader *)&checker,(PointerReader *)&existing,(word *)0x0);
        local_80 = (ArrayPtr<const_char>)
                   capnp::schema::Node::Reader::getDisplayName((Reader *)&checker);
        local_48 = (WirePointer *)(*ppRVar14)->encodedNode;
        local_58 = (ArrayPtr<const_char>)ZEXT816(0);
        local_40 = 0x7fffffff;
        capnp::_::PointerReader::getStruct(&existing._reader,(PointerReader *)&local_58,(word *)0x0)
        ;
        local_58 = (ArrayPtr<const_char>)
                   capnp::schema::Node::Reader::getDisplayName((Reader *)&existing._reader);
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema_const*&,capnp::_::RawSchema_const*&>&,char_const(&)[53],unsigned_long_const&,capnp::Text::Reader,capnp::Text::Reader>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x531,FAILED,"schema->canCastTo == nativeSchema",
                   "_kjCondition,\"two different compiled-in type have the same type ID\", nativeSchema->id, readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(), readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName()"
                   ,&_kjCondition,
                   (char (*) [53])"two different compiled-in type have the same type ID",
                   &pRVar13->id,(Reader *)&local_80,(Reader *)&local_58);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
  }
  if (bVar16) {
    if (((ulong)pRVar11 & 1) == 0) {
      schema->canCastTo = nativeSchema_local;
      if (nativeSchema_local->dependencyCount != 0) {
        uVar15 = 0;
        do {
          loadNative(this,nativeSchema_local->dependencies[uVar15]);
          uVar15 = uVar15 + 1;
        } while (uVar15 < nativeSchema_local->dependencyCount);
      }
    }
    else {
      checker.loader = (Impl *)(nativeSchema_local->defaultBrand).generic;
      checker.nodeName.super_StringPtr.content.ptr =
           (char *)(nativeSchema_local->defaultBrand).scopes;
      checker.nodeName.super_StringPtr.content.size_ =
           (size_t)(nativeSchema_local->defaultBrand).dependencies;
      uVar1._0_4_ = (nativeSchema_local->defaultBrand).scopeCount;
      uVar1._4_4_ = (nativeSchema_local->defaultBrand).dependencyCount;
      pIVar2 = (nativeSchema_local->defaultBrand).lazyInitializer;
      checker.existingNode._reader.capTable._0_1_ = SUB81(pIVar2,0);
      checker.existingNode._reader.capTable._1_7_ = (undefined7)((ulong)pIVar2 >> 8);
      checker.existingNode._reader.data._0_1_ =
           (undefined1)*(undefined8 *)&nativeSchema_local->mayContainCapabilities;
      checker.existingNode._reader.data._1_7_ =
           (undefined7)((ulong)*(undefined8 *)&nativeSchema_local->mayContainCapabilities >> 8);
      uVar3 = nativeSchema_local->id;
      pwVar4 = nativeSchema_local->encodedNode;
      uVar8 = nativeSchema_local->encodedSize;
      uVar9 = *(undefined4 *)&nativeSchema_local->field_0x14;
      ppRVar12 = nativeSchema_local->dependencies;
      puVar5 = nativeSchema_local->membersByName;
      uVar6 = nativeSchema_local->dependencyCount;
      uVar7 = nativeSchema_local->memberCount;
      pRVar13 = nativeSchema_local->canCastTo;
      schema->membersByDiscriminant = nativeSchema_local->membersByDiscriminant;
      schema->canCastTo = pRVar13;
      schema->membersByName = puVar5;
      schema->dependencyCount = uVar6;
      schema->memberCount = uVar7;
      schema->encodedSize = uVar8;
      *(undefined4 *)&schema->field_0x14 = uVar9;
      schema->dependencies = ppRVar12;
      schema->id = uVar3;
      schema->encodedNode = pwVar4;
      (schema->defaultBrand).generic = (RawSchema *)checker.loader;
      (schema->defaultBrand).scopes = (Scope *)checker.nodeName.super_StringPtr.content.ptr;
      (schema->defaultBrand).dependencies =
           (Dependency *)checker.nodeName.super_StringPtr.content.size_;
      (schema->defaultBrand).scopeCount = (undefined4)uVar1;
      (schema->defaultBrand).dependencyCount = uVar1._4_4_;
      *(ulong *)((long)&(schema->defaultBrand).scopeCount + 1) =
           CONCAT17(checker.existingNode._reader.capTable._0_1_,(int7)((ulong)uVar1 >> 8));
      *(ulong *)((long)&(schema->defaultBrand).lazyInitializer + 1) =
           CONCAT17(checker.existingNode._reader.data._0_1_,
                    checker.existingNode._reader.capTable._1_7_);
      (schema->defaultBrand).generic = schema;
      schema->canCastTo = nativeSchema_local;
      checker.existingNode._reader.segment._0_4_ = (undefined4)uVar1;
      checker.existingNode._reader.segment._4_4_ = uVar1._4_4_;
      ppRVar12 = (RawSchema **)
                 kj::Arena::allocateBytes(&this->arena,(ulong)schema->dependencyCount << 3,8,false);
      if (nativeSchema_local->dependencyCount != 0) {
        uVar15 = 0;
        do {
          pRVar13 = loadNative(this,nativeSchema_local->dependencies[uVar15]);
          ppRVar12[uVar15] = pRVar13;
          uVar15 = uVar15 + 1;
        } while (uVar15 < nativeSchema_local->dependencyCount);
      }
      schema->dependencies = ppRVar12;
      local_70.ptr.field_1.value.ptr = (Scope *)0x0;
      local_70.ptr.field_1.value.size_ = 0;
      local_70.ptr.isSet = true;
      AVar17 = makeBrandedDependencies(this,schema,&local_70);
      (schema->defaultBrand).dependencies = AVar17.ptr;
      (schema->defaultBrand).dependencyCount = (uint32_t)AVar17.size_;
      kj::
      Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
      ::find<0ul,unsigned_long_const&>
                ((Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
                  *)&existing,(unsigned_long *)&this->structSizeRequirements);
      if (existing._reader.segment != (SegmentReader *)0x0) {
        applyStructSizeRequirement
                  (this,schema,(uint)(ushort)((existing._reader.segment)->id).value,
                   (uint)*(ushort *)((long)&((existing._reader.segment)->id).value + 2));
      }
    }
    if (((ulong)ppRVar14 & 1) != 0) {
      schema->lazyInitializer = (Initializer *)0x0;
      (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    }
  }
  return schema;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadNative(const _::RawSchema* nativeSchema) {
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_SOME(match, schemas.find(nativeSchema->id)) {
    schema = match;
    if (schema->canCastTo != nullptr) {
      // Already loaded natively, or we're currently in the process of loading natively and there
      // was a dependency cycle.
      KJ_REQUIRE(schema->canCastTo == nativeSchema,
          "two different compiled-in type have the same type ID",
          nativeSchema->id,
          readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(),
          readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName());
      return schema;
    } else {
      auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
      auto native = readMessageUnchecked<schema::Node>(nativeSchema->encodedNode);
      CompatibilityChecker checker(*this);
      shouldReplace = checker.shouldReplace(existing, native, true);
      shouldClearInitializer = schema->lazyInitializer != nullptr;
    }
  } else {
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = nullptr;
    schema->defaultBrand.lazyInitializer = nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;  // already cleared above
    schemas.insert(nativeSchema->id, schema);
  }